

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

UniValue *
blockToJSON(UniValue *__return_storage_ptr__,BlockManager *blockman,CBlock *block,CBlockIndex *tip,
           CBlockIndex *blockindex,TxVerbosity verbosity)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer psVar2;
  string key;
  string key_00;
  string key_01;
  string key_02;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  uint32_t uVar3;
  bool bVar4;
  pointer psVar5;
  UniValue *__return_storage_ptr___00;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  CTxUndo *txundo;
  undefined4 in_register_0000008c;
  undefined8 uVar10;
  long lVar11;
  long in_FS_OFFSET;
  CBlockUndo blockUndo;
  UniValue objTx;
  UniValue txs;
  undefined8 in_stack_fffffffffffffbd8;
  uint uVar12;
  undefined4 uVar14;
  CBlockIndex *pCVar13;
  undefined8 in_stack_fffffffffffffbf8;
  CBlock *pCVar15;
  undefined8 uVar16;
  pointer in_stack_fffffffffffffc08;
  pointer in_stack_fffffffffffffc10;
  pointer in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  undefined8 in_stack_fffffffffffffc30;
  SizeComputer *pSVar17;
  undefined8 in_stack_fffffffffffffc38;
  SizeComputer in_stack_fffffffffffffc40;
  SizeComputer SVar18;
  pointer in_stack_fffffffffffffc48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  vector<UniValue,_std::allocator<UniValue>_> local_398;
  long *local_380 [2];
  long local_370 [2];
  VType local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<UniValue,_std::allocator<UniValue>_> local_320;
  uint256 local_308;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8;
  uint7 uStack_2d7;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_288;
  UniValue local_270;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [9];
  undefined4 local_1ff;
  undefined2 local_1fb;
  char local_1f9;
  undefined1 local_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  pointer local_1d0;
  pointer pbStack_1c8;
  pointer local_1c0;
  pointer pUStack_1b8;
  pointer local_1b0;
  pointer pUStack_1a8;
  UniValue local_1a0;
  long *local_148 [2];
  long local_138 [2];
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  UniValue local_b0;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  uVar10 = CONCAT44(in_register_0000008c,verbosity);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  blockheaderToJSON(__return_storage_ptr__,tip,blockindex);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"strippedsize","");
  local_1f8._0_8_ = &TX_NO_WITNESS;
  v = &block->vtx;
  local_2c8._0_8_ = &DAT_00000050;
  local_1f8._8_8_ = (SizeComputer *)local_2c8;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            ((VectorFormatter<DefaultFormatter> *)&stack0xfffffffffffffc08,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_1f8,v);
  local_308.super_base_blob<256U>.m_data._M_elems._0_4_ = local_2c8._0_4_;
  UniValue::UniValue<int,_int,_true>(&local_b0,(int *)&local_308);
  key._M_string_length._0_4_ = (int)blockindex;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key._M_string_length._4_4_ = (int)((ulong)blockindex >> 0x20);
  key.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  key.field_2._8_8_ = blockman;
  val_01.val._M_dataplus._M_p = (pointer)uVar10;
  val_01._0_8_ = in_stack_fffffffffffffbf8;
  val_01.val._M_string_length = (size_type)in_stack_fffffffffffffc08;
  val_01.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc10;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffffc18;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc20;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffc28;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffc2c;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc30;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc38;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc40.nSize;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc48;
  UniValue::pushKV(__return_storage_ptr__,key,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
    operator_delete(local_b0.val._M_dataplus._M_p,local_b0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"size","");
  local_1f8._0_8_ = &TX_WITH_WITNESS;
  local_2c8._0_8_ = &DAT_00000050;
  local_1f8._8_8_ = (SizeComputer *)local_2c8;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            ((VectorFormatter<DefaultFormatter> *)&stack0xfffffffffffffc08,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_1f8,v);
  local_308.super_base_blob<256U>.m_data._M_elems._0_4_ = local_2c8._0_4_;
  UniValue::UniValue<int,_int,_true>(&local_128,(int *)&local_308);
  key_00._M_string_length._0_4_ = (int)blockindex;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key_00._M_string_length._4_4_ = (int)((ulong)blockindex >> 0x20);
  key_00.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  key_00.field_2._8_8_ = blockman;
  val_02.val._M_dataplus._M_p = (pointer)uVar10;
  val_02._0_8_ = block;
  val_02.val._M_string_length = (size_type)in_stack_fffffffffffffc08;
  val_02.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc10;
  val_02.val.field_2._8_8_ = in_stack_fffffffffffffc18;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc20;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffc28;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffc2c;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc30;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc38;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc40.nSize;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc48;
  UniValue::pushKV(__return_storage_ptr__,key_00,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
    operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"weight","");
  local_1f8._0_8_ = &TX_NO_WITNESS;
  local_2c8._0_8_ = &DAT_00000050;
  local_1f8._8_8_ = (SizeComputer *)local_2c8;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            ((VectorFormatter<DefaultFormatter> *)&stack0xfffffffffffffc08,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_1f8,v);
  uVar16 = local_2c8._0_8_;
  local_1f8._0_8_ = &TX_WITH_WITNESS;
  local_2c8._0_8_ = &DAT_00000050;
  local_1f8._8_8_ = (SizeComputer *)local_2c8;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            ((VectorFormatter<DefaultFormatter> *)&stack0xfffffffffffffc08,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_1f8,v);
  local_308.super_base_blob<256U>.m_data._M_elems._0_4_ = (int)uVar16 * 3 + local_2c8._0_4_;
  UniValue::UniValue<int,_int,_true>(&local_1a0,(int *)&local_308);
  key_01._M_string_length._0_4_ = (int)blockindex;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key_01._M_string_length._4_4_ = (int)((ulong)blockindex >> 0x20);
  key_01.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  key_01.field_2._8_8_ = blockman;
  val_03.val._M_dataplus._M_p = (pointer)uVar10;
  val_03._0_8_ = block;
  val_03.val._M_string_length = (size_type)in_stack_fffffffffffffc08;
  val_03.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc10;
  val_03.val.field_2._8_8_ = in_stack_fffffffffffffc18;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc20;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffc28;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffc2c;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc30;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc38;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc40.nSize;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc48;
  UniValue::pushKV(__return_storage_ptr__,key_01,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0.keys);
  pCVar15 = block;
  uVar16 = uVar10;
  pCVar13 = blockindex;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.val._M_dataplus._M_p != &local_1a0.val.field_2) {
    operator_delete(local_1a0.val._M_dataplus._M_p,local_1a0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  local_218 = local_208;
  uVar6 = 0;
  local_1f8._8_8_ = &local_1e0;
  local_1f8._0_4_ = 2;
  local_1e0._M_local_buf[0] = '\0';
  local_1e0._M_allocated_capacity._1_7_ = (undefined7)local_208._1_8_;
  local_1e0._M_local_buf[8] = SUB81(local_208._1_8_,7);
  local_1e0._9_4_ = local_1ff;
  local_1e0._13_2_ = local_1fb;
  local_1e0._M_local_buf[0xf] = local_1f9;
  local_1f8._16_8_ = 0;
  local_210 = 0;
  local_208[0] = 0;
  local_1d0 = (pointer)0x0;
  pbStack_1c8 = (pointer)0x0;
  local_1c0 = (pointer)0x0;
  pUStack_1b8 = (pointer)0x0;
  local_1b0 = (pointer)0x0;
  pUStack_1a8 = (pointer)0x0;
  if ((int)uVar10 - 1U < 2) {
    in_stack_fffffffffffffc08 = (pointer)0x0;
    in_stack_fffffffffffffc10 = (pointer)0x0;
    in_stack_fffffffffffffc18 = (pointer)0x0;
    local_2c8._0_8_ = &cs_main;
    local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_2c8);
    bVar4 = node::BlockManager::IsBlockPruned(blockman,blockindex);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_2c8);
    uVar14 = (undefined4)((ulong)pCVar13 >> 0x20);
    if (bVar4) {
LAB_0098e279:
      uVar12 = 0;
    }
    else {
      local_2c8._0_8_ = &cs_main;
      local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_2c8);
      uVar3 = blockindex->nStatus;
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_2c8);
      if ((uVar3 & 0x10) == 0) goto LAB_0098e279;
      bVar4 = node::BlockManager::UndoReadFromDisk
                        (blockman,(CBlockUndo *)&stack0xfffffffffffffc08,blockindex);
      uVar12 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
      if (!bVar4) {
LAB_0098e7d4:
        __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
        local_2c8._0_8_ = local_2c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2c8,
                   "Undo data expected but can\'t be read. This could be due to disk corruption or a conflict with a pruning event."
                   ,"");
        JSONRPCError(__return_storage_ptr___00,-0x7f5b,(string *)local_2c8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_0098ea84;
      }
    }
    psVar5 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((block->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2b8 + 8);
      lVar9 = -0x18;
      uVar12 = uVar12 ^ 1;
      lVar11 = 0;
      uVar8 = 0;
      do {
        if (uVar8 == 0 || (char)uVar12 != '\0') {
          txundo = (CTxUndo *)0x0;
        }
        else {
          uVar7 = ((long)in_stack_fffffffffffffc10 - (long)in_stack_fffffffffffffc08 >> 3) *
                  -0x5555555555555555;
          if (uVar7 < uVar8 - 1 || uVar7 - (uVar8 - 1) == 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0098ea84;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_0098e7d4;
          }
          txundo = (CTxUndo *)
                   ((long)&(in_stack_fffffffffffffc08->vprevout).
                           super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar9);
        }
        local_2c8._0_4_ = 1;
        local_2e8 = &local_2d8;
        local_2b8._8_8_ = (ulong)uStack_2d7 << 8;
        local_2b8._16_8_ = uStack_2d0;
        local_2b8._0_8_ = 0;
        local_2e0 = 0;
        local_2d8 = 0;
        vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_308.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        local_308.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        local_2c8._8_8_ = paVar1;
        TxToUniv(*(CTransaction **)
                  ((long)&(psVar5->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  + lVar11),&local_308,(UniValue *)local_2c8,true,txundo,(TxVerbosity)uVar16);
        local_360 = local_2c8._0_4_;
        local_358 = &local_348;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._8_8_ == paVar1) {
          local_348._8_8_ = local_2b8._16_8_;
        }
        else {
          local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._8_8_;
        }
        local_348._M_allocated_capacity = local_2b8._8_8_;
        local_350 = local_2b8._0_8_;
        local_2b8._0_8_ = 0;
        local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
        local_338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_2a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_2a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_2a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_288.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        val_00.val._M_dataplus._M_p._0_4_ = uVar12;
        val_00._0_8_ = in_stack_fffffffffffffbd8;
        val_00.val._M_dataplus._M_p._4_4_ = uVar14;
        val_00.val._M_string_length = (size_type)__return_storage_ptr__;
        val_00.val.field_2._M_allocated_capacity = (size_type)blockman;
        val_00.val.field_2._8_8_ = pCVar15;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar16;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc08;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc10;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc18;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc20;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffc28;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffc2c;
        local_2c8._8_8_ = paVar1;
        UniValue::push_back((UniValue *)local_1f8,val_00);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_320);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_338);
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348._M_allocated_capacity + 1);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_288);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._8_8_ != paVar1) {
          operator_delete((void *)local_2c8._8_8_,local_2b8._8_8_ + 1);
        }
        uVar8 = uVar8 + 1;
        psVar5 = (pCVar15->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x18;
        lVar11 = lVar11 + 0x10;
      } while (uVar8 < (ulong)((long)(pCVar15->vtx).
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4)
              );
    }
    std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector
              ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)&stack0xfffffffffffffc08);
    pCVar13 = (CBlockIndex *)CONCAT44(uVar14,uVar12);
  }
  else if ((int)uVar10 == 0) {
    psVar5 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar5 != psVar2) {
      do {
        base_blob<256u>::GetHex_abi_cxx11_
                  ((string *)local_2c8,
                   &((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->hash);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_270,(string *)local_2c8);
        val.val._M_dataplus._M_p._0_4_ = (int)pCVar13;
        val._0_8_ = in_stack_fffffffffffffbd8;
        val.val._M_dataplus._M_p._4_4_ = (int)((ulong)pCVar13 >> 0x20);
        val.val._M_string_length = (size_type)__return_storage_ptr__;
        val.val.field_2._M_allocated_capacity = (size_type)blockman;
        val.val.field_2._8_8_ = pCVar15;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar16;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc08;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc10;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc18;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc20;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffc28;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffc2c;
        UniValue::push_back((UniValue *)local_1f8,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_270.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_270.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270.val._M_dataplus._M_p != &local_270.val.field_2) {
          operator_delete(local_270.val._M_dataplus._M_p,
                          local_270.val.field_2._M_allocated_capacity + 1);
        }
        if ((RecursiveMutex *)local_2c8._0_8_ != (RecursiveMutex *)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
        }
        psVar5 = psVar5 + 1;
      } while (psVar5 != psVar2);
    }
  }
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"tx","");
  uVar10 = local_1f8._16_8_;
  pSVar17 = (SizeComputer *)local_1f8._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._8_8_ == &local_1e0) {
    in_stack_fffffffffffffc48 =
         (pointer)CONCAT17(local_1e0._M_local_buf[0xf],
                           CONCAT25(local_1e0._13_2_,
                                    CONCAT41(local_1e0._9_4_,local_1e0._M_local_buf[8])));
    pSVar17 = (SizeComputer *)&stack0xfffffffffffffc40;
  }
  SVar18.nSize._1_7_ = local_1e0._M_allocated_capacity._1_7_;
  SVar18.nSize._0_1_ = local_1e0._M_local_buf[0];
  local_1f8._16_8_ = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_1d0;
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_1c8;
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1c0;
  local_1c0 = (pointer)0x0;
  local_1d0 = (pointer)0x0;
  pbStack_1c8 = (pointer)0x0;
  local_398.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = pUStack_1b8;
  local_398.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_1b0;
  local_398.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pUStack_1a8;
  pUStack_1a8 = (pointer)0x0;
  pUStack_1b8 = (pointer)0x0;
  local_1b0 = (pointer)0x0;
  key_02._M_string_length._0_4_ = (int)pCVar13;
  key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key_02._M_string_length._4_4_ = (int)((ulong)pCVar13 >> 0x20);
  key_02.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  key_02.field_2._8_8_ = blockman;
  val_04.val._M_dataplus._M_p = (pointer)uVar16;
  val_04._0_8_ = pCVar15;
  val_04.val._M_string_length = (size_type)in_stack_fffffffffffffc08;
  val_04.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc10;
  val_04.val.field_2._8_8_ = in_stack_fffffffffffffc18;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc20;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = local_1f8._0_4_;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffc2c;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar17;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)uVar10;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SVar18.nSize;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc48;
  local_1f8._8_8_ = &local_1e0;
  UniValue::pushKV(__return_storage_ptr__,key_02,val_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_398);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b0);
  if (pSVar17 != (SizeComputer *)&stack0xfffffffffffffc40) {
    operator_delete(pSVar17,SVar18.nSize + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&pUStack_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._8_8_ != &local_1e0) {
    operator_delete((void *)local_1f8._8_8_,
                    CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0098ea84:
  __stack_chk_fail();
}

Assistant:

UniValue blockToJSON(BlockManager& blockman, const CBlock& block, const CBlockIndex& tip, const CBlockIndex& blockindex, TxVerbosity verbosity)
{
    UniValue result = blockheaderToJSON(tip, blockindex);

    result.pushKV("strippedsize", (int)::GetSerializeSize(TX_NO_WITNESS(block)));
    result.pushKV("size", (int)::GetSerializeSize(TX_WITH_WITNESS(block)));
    result.pushKV("weight", (int)::GetBlockWeight(block));
    UniValue txs(UniValue::VARR);

    switch (verbosity) {
        case TxVerbosity::SHOW_TXID:
            for (const CTransactionRef& tx : block.vtx) {
                txs.push_back(tx->GetHash().GetHex());
            }
            break;

        case TxVerbosity::SHOW_DETAILS:
        case TxVerbosity::SHOW_DETAILS_AND_PREVOUT:
            CBlockUndo blockUndo;
            const bool is_not_pruned{WITH_LOCK(::cs_main, return !blockman.IsBlockPruned(blockindex))};
            bool have_undo{is_not_pruned && WITH_LOCK(::cs_main, return blockindex.nStatus & BLOCK_HAVE_UNDO)};
            if (have_undo && !blockman.UndoReadFromDisk(blockUndo, blockindex)) {
                throw JSONRPCError(RPC_INTERNAL_ERROR, "Undo data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
            }
            for (size_t i = 0; i < block.vtx.size(); ++i) {
                const CTransactionRef& tx = block.vtx.at(i);
                // coinbase transaction (i.e. i == 0) doesn't have undo data
                const CTxUndo* txundo = (have_undo && i > 0) ? &blockUndo.vtxundo.at(i - 1) : nullptr;
                UniValue objTx(UniValue::VOBJ);
                TxToUniv(*tx, /*block_hash=*/uint256(), /*entry=*/objTx, /*include_hex=*/true, txundo, verbosity);
                txs.push_back(std::move(objTx));
            }
            break;
    }

    result.pushKV("tx", std::move(txs));

    return result;
}